

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::PLRUUpdate(Cache *this,uint32_t block_id)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  if (1 < (this->policy).associativity) {
    uVar2 = (ulong)(this->policy).associativity;
    uVar5 = (ulong)block_id % uVar2;
    piVar1 = this->plru_bit[block_id / uVar2];
    uVar3 = 1;
    do {
      uVar6 = (int)(uVar5 >> 0x1f) + (int)uVar5;
      iVar4 = (int)uVar5 - (uVar6 & 0xfffffffe);
      piVar1[(int)uVar3] = (uint)(iVar4 == 0);
      uVar3 = iVar4 + uVar3 * 2;
      uVar5 = (ulong)(uint)((int)uVar6 >> 1);
    } while (uVar3 < (this->policy).associativity);
  }
  return;
}

Assistant:

void Cache::PLRUUpdate(uint32_t block_id) {
    uint32_t set_id = block_id / this->policy.associativity;
    uint32_t id2 = block_id % this->policy.associativity;
    int node, tmp;
    for (node = 1, tmp = id2; node < this->policy.associativity;) {
        plru_bit[set_id][node] = tmp % 2 == 0 ? 1 : 0;
        node = node * 2 + tmp % 2;
        tmp /= 2;
    }
}